

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

void voc_parse_disambig(voccxdef *ctx)

{
  undefined8 uVar1;
  long lVar2;
  void *p_00;
  int iVar3;
  int iVar4;
  void *pvVar5;
  voccxdef *__s;
  undefined8 *puVar6;
  undefined2 *puVar7;
  uchar *puVar8;
  size_t sVar9;
  void *in_RDI;
  uint len_1;
  char qu;
  char *p1;
  size_t needed;
  int t;
  char *rpl_text;
  int unk_idx;
  char *unk;
  int lastwrd;
  int firstwrd;
  uint subsiz_1;
  uchar *subp_1;
  uint subsiz;
  uchar *subp;
  uint len;
  int unknown_count;
  int err;
  int silent;
  int i;
  char *p;
  int tokcnt;
  uint lstsiz;
  uchar *lstp;
  uint objsiz;
  uchar *objp;
  uint toksiz;
  uchar *tokp;
  prpnum verprop;
  prpnum accprop;
  prpnum defprop;
  objnum otherobj;
  objnum prep;
  objnum verb;
  objnum actor;
  char *oopsbuf;
  char *cmdbuf;
  char **cmd;
  int objcnt;
  vocoldef *outlist;
  vocoldef *inlist;
  runcxdef *rcx;
  uchar *save_sp;
  voccxdef ctx_copy;
  uint *in_stack_ffffffffffffec78;
  undefined4 in_stack_ffffffffffffec80;
  undefined4 in_stack_ffffffffffffec84;
  uint in_stack_ffffffffffffec9c;
  voccxdef *ctx_00;
  int local_127c;
  int local_1274;
  uchar *local_1260;
  int local_120c;
  undefined1 local_11e8 [642];
  prpnum in_stack_fffffffffffff09a;
  prpnum in_stack_fffffffffffff09c;
  prpnum in_stack_fffffffffffff09e;
  vocoldef *in_stack_fffffffffffff0a0;
  vocoldef *in_stack_fffffffffffff0a8;
  voccxdef *in_stack_fffffffffffff0b0;
  char **in_stack_fffffffffffff0f0;
  objnum in_stack_fffffffffffff0f8;
  objnum in_stack_fffffffffffff100;
  objnum in_stack_fffffffffffff108;
  objnum in_stack_fffffffffffff110;
  char *in_stack_fffffffffffff118;
  int in_stack_fffffffffffff120;
  int local_c80;
  
  puVar6 = *(undefined8 **)((long)in_RDI + 0x10);
  uVar1 = *(undefined8 *)((long)in_RDI + 0x11b0);
  pvVar5 = voc_stk_alo((voccxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
                       (uint)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  __s = (voccxdef *)
        voc_stk_alo((voccxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
                    (uint)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  voc_stk_alo((voccxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
              (uint)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  iVar3 = (int)((ulong)in_stack_ffffffffffffec78 >> 0x20);
  if (*(char *)(lVar2 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),iVar3);
  }
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x02') {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),iVar3);
  }
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  if ((*(char *)(lVar2 + -0x10) != '\x02') && (*(char *)puVar6[4] != '\x05')) {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),iVar3);
  }
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  if ((*(char *)(lVar2 + -0x10) != '\x02') && (*(char *)puVar6[4] != '\x05')) {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),iVar3);
  }
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\x01') {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),iVar3);
  }
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\r') {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),iVar3);
  }
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\a') {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),iVar3);
  }
  iVar3 = osrp2(*(void **)(puVar6[4] + 8));
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  if (*(char *)(lVar2 + -0x10) != '\a') {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
            (int)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  }
  p_00 = *(void **)(puVar6[4] + 8);
  iVar4 = osrp2(p_00);
  lVar2 = puVar6[4];
  puVar6[4] = lVar2 + -0x10;
  if ((*(char *)(lVar2 + -0x10) != '\b') && (*(char *)puVar6[4] != '\x05')) {
    *(undefined4 *)(*(long *)*puVar6 + 0x68) = 0;
    runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
            (int)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  }
  while (iVar3 != 2) {
    lstadv((uchar **)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
           in_stack_ffffffffffffec78);
  }
  puVar6 = (undefined8 *)
           voc_stk_alo((voccxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
                       (uint)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  *puVar6 = 0;
  if ((iVar4 != 2) && (*(char *)((long)p_00 + 2) == '\x01')) {
    lstadv((uchar **)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
           in_stack_ffffffffffffec78);
  }
  while (iVar4 != 2) {
    if (*(char *)((long)p_00 + 2) == '\a') {
      iVar3 = osrp2((void *)((long)p_00 + 3));
      while (iVar3 != 2) {
        lstadv((uchar **)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
               in_stack_ffffffffffffec78);
      }
    }
    lstadv((uchar **)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
           in_stack_ffffffffffffec78);
  }
  puVar7 = (undefined2 *)
           voc_stk_alo((voccxdef *)CONCAT44(in_stack_ffffffffffffec84,in_stack_ffffffffffffec80),
                       (uint)((ulong)in_stack_ffffffffffffec78 >> 0x20));
  *puVar7 = 0xffff;
  *(undefined4 *)(puVar7 + 0x10) = 0;
  memcpy(local_11e8,in_RDI,0x11c0);
  ctx_00 = __s;
  local_127c = vocdisambig(in_stack_fffffffffffff0b0,in_stack_fffffffffffff0a8,
                           in_stack_fffffffffffff0a0,in_stack_fffffffffffff09e,
                           in_stack_fffffffffffff09c,in_stack_fffffffffffff09a,
                           in_stack_fffffffffffff0f0,in_stack_fffffffffffff0f8,
                           in_stack_fffffffffffff100,in_stack_fffffffffffff108,
                           in_stack_fffffffffffff110,in_stack_fffffffffffff118,
                           in_stack_fffffffffffff120);
  if ((local_127c == 0) || (local_127c == 0x2c)) {
    local_1274 = 0;
    while (*(short *)((long)pvVar5 + (long)local_1274 * 0x28) != -1) {
      local_1274 = local_1274 + 1;
    }
    local_120c = local_1274;
  }
  else {
    local_120c = 0;
  }
  if (((local_c80 != 0) || (local_127c == 0x2d)) && (strlen((char *)__s), local_c80 != 0)) {
    local_127c = 0x2b;
  }
  puVar8 = voc_push_list_siz(ctx_00,in_stack_ffffffffffffec9c);
  *puVar8 = '\x01';
  oswp4s(puVar8 + 1,(long)local_127c);
  local_1260 = puVar8 + 5;
  if ((local_127c == 0) || (local_127c == 0x2c)) {
    for (local_1274 = 0; local_1274 < local_120c; local_1274 = local_1274 + 1) {
      *local_1260 = '\x02';
      oswp2(local_1260 + 1,(uint)*(ushort *)((long)pvVar5 + (long)local_1274 * 0x28));
      local_1260 = local_1260 + 3;
    }
  }
  else if ((local_c80 != 0) || (local_127c == 0x2d)) {
    *local_1260 = '\x03';
    sVar9 = strlen((char *)__s);
    oswp2(puVar8 + 6,(int)sVar9 + 2);
    memcpy(puVar8 + 8,__s,sVar9 & 0xffffffff);
  }
  *(undefined8 *)((long)in_RDI + 0x11b0) = uVar1;
  return;
}

Assistant:

void voc_parse_disambig(voccxdef *ctx)
{
    voccxdef ctx_copy;
    uchar *save_sp;
    runcxdef *rcx = ctx->voccxrun;
    vocoldef *inlist;
    vocoldef *outlist;
    int objcnt;
    char **cmd;
    char *cmdbuf;
    char *oopsbuf;
    objnum actor;
    objnum verb;
    objnum prep;
    objnum otherobj;
    prpnum defprop;
    prpnum accprop;
    prpnum verprop;
    uchar *tokp;
    uint toksiz;
    uchar *objp;
    uint objsiz;
    uchar *lstp;
    uint lstsiz;
    int tokcnt;
    char *p;
    int i;
    int silent;
    int err;
    int unknown_count;

    /* allocate our stack arrays */
    voc_enter(ctx, &save_sp);
    VOC_MAX_ARRAY(ctx, vocoldef, outlist);
    VOC_STK_ARRAY(ctx, char,     cmdbuf, VOCBUFSIZ);
    VOC_STK_ARRAY(ctx, char,     oopsbuf, VOCBUFSIZ);

    /* get the actor, verb, prep, and otherobj arguments */
    actor = runpopobj(rcx);
    verb = runpopobj(rcx);
    prep = runpopobjnil(rcx);
    otherobj = runpopobjnil(rcx);

    /* 
     *   get the usage parameter, and use it to select the appropriate
     *   defprop and accprop 
     */
    switch(runpopnum(rcx))
    {
    case VOC_PRO_RESOLVE_DOBJ:
    default:
        defprop = PRP_DODEFAULT;
        accprop = PRP_VALIDDO;
        break;

    case VOC_PRO_RESOLVE_IOBJ:
        defprop = PRP_IODEFAULT;
        accprop = PRP_VALIDIO;
        break;

    case VOC_PRO_RESOLVE_ACTOR:
        defprop = PRP_DODEFAULT;
        accprop = PRP_VALIDACTOR;
        break;
    }
    
    /* get the verprop argument */
    verprop = runpopprp(rcx);

    /* pop the token list, and read and skip the length prefix */
    tokp = runpoplst(rcx);
    toksiz = osrp2(tokp) - 2;
    tokp += 2;

    /* pop the object list, and read and skip the length prefix */
    objp = runpoplst(rcx);
    objsiz = osrp2(objp) - 2;
    objp += 2;

    /* pop the "silent" flag */
    silent = runpoplog(rcx);

    /* count the tokens */
    for (lstp = tokp, lstsiz = toksiz, tokcnt = 0 ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* if this is a string, count it */
        if (*lstp == DAT_SSTRING)
            ++tokcnt;
    }

    /* allocate stack space for the command pointers and buffer */
    VOC_STK_ARRAY(ctx, char *, cmd, tokcnt + 1);

    /* extract the tokens into our pointer buffer */
    for (lstp = tokp, lstsiz = toksiz, i = 0, p = cmdbuf ;
         lstsiz != 0 ; lstadv(&lstp, &lstsiz))
    {
        /* if this is a string, count and size it */
        if (*lstp == DAT_SSTRING)
        {
            uint len;
            
            /* store a pointer to the word in the command buffer */
            cmd[i++] = p;

            /* copy the token into the command buffer and null-terminate it */
            len = osrp2(lstp + 1) - 2;
            memcpy(p, lstp + 3, len);
            p[len] = '\0';

            /* move the buffer pointer past this word */
            p += len + 1;
        }
    }

    /* store a null at the end of the command pointer list */
    cmd[i] = 0;

    /*
     *   The object list is provided in the same format as the list
     *   returned by voc_parse_np(), but the leading index number is
     *   optional.  We don't need the leading index for anything, so if
     *   it's there, simply skip it so that we can start with the first
     *   sublist.  
     */
    if (objsiz > 0 && *objp == DAT_NUMBER)
        lstadv(&objp, &objsiz);

    /*
     *   Count the objects in the object list, so that we can figure out
     *   how much we need to allocate for the input object list.  
     */
    for (lstp = objp, lstsiz = objsiz, objcnt = 0 ; lstsiz != 0 ;
         lstadv(&lstp, &lstsiz))
    {
        /* if this is a sublist, parse it */
        if (*lstp == DAT_LIST)
        {
            uchar *subp;
            uint subsiz;

            /* get the sublist pointer, and read and skip the size prefix */
            subp = lstp + 1;
            subsiz = osrp2(subp) - 2;
            subp += 2;

            /* scan the sublist */
            while (subsiz > 0)
            {
                /* if this is an object, count it */
                if (*subp == DAT_OBJECT || *subp == DAT_NIL)
                    ++objcnt;

                /* skip this element */
                lstadv(&subp, &subsiz);
            }
        }
    }

    /* allocate space for the input list */
    VOC_STK_ARRAY(ctx, vocoldef, inlist, objcnt + 1);

    /* we don't have any unknown words yet */
    unknown_count = 0;

    /* parse the list, filling in the input array */
    for (lstp = objp, lstsiz = objsiz, i = 0 ; lstsiz != 0 ;
         lstadv(&lstp, &lstsiz))
    {
        /* if this is a sublist, parse it */
        if (*lstp == DAT_LIST)
        {
            uchar *subp;
            uint subsiz;
            int firstwrd, lastwrd;

            /* get the sublist pointer, and read and skip the size prefix */
            subp = lstp + 1;
            subsiz = osrp2(subp) - 2;
            subp += 2;

            /* in case we don't find token indices, clear them */
            firstwrd = 0;
            lastwrd = 0;

            /* 
             *   the first two elements of the list are the token indices
             *   of the first and last words of this object's noun phrase 
             */
            if (subsiz > 0 && *subp == DAT_NUMBER)
            {
                /* read the first index, adjusting to zero-based indexing */
                firstwrd = (int)osrp4(subp+1) - 1;

                /* make sure it's in range */
                if (firstwrd < 0)
                    firstwrd = 0;
                else if (firstwrd > tokcnt)
                    firstwrd = tokcnt;

                /* skip it */
                lstadv(&subp, &subsiz);
            }
            if (subsiz > 0 && *subp == DAT_NUMBER)
            {
                /* read the last index, adjusting to zero-based indexing */
                lastwrd = (int)osrp4(subp+1) - 1;

                /* make sure it's in range */
                if (lastwrd < firstwrd)
                    lastwrd = firstwrd;
                else if (lastwrd > tokcnt)
                    lastwrd = tokcnt;

                /* skip it */
                lstadv(&subp, &subsiz);
            }

            /* scan the sublist */
            while (subsiz > 0)
            {
                /* if this is an object, store it */
                if (*subp == DAT_OBJECT || *subp == DAT_NIL)
                {
                    /* store the object */
                    if (*subp == DAT_OBJECT)
                        inlist[i].vocolobj = osrp2(subp+1);
                    else
                        inlist[i].vocolobj = MCMONINV;

                    /* set the first and last word pointers */
                    inlist[i].vocolfst = cmd[firstwrd];
                    inlist[i].vocollst = cmd[lastwrd];

                    /* skip the object */
                    lstadv(&subp, &subsiz);

                    /* check for flags */
                    if (subsiz > 0 && *subp == DAT_NUMBER)
                    {
                        /* get the flags value */
                        inlist[i].vocolflg = (int)osrp4(subp+1);

                        /* skip the number in the list */
                        lstadv(&subp, &subsiz);
                    }
                    else
                    {
                        /* clear the flags */
                        inlist[i].vocolflg = 0;
                    }

                    /* if an unknown word was involved, note it */
                    if ((inlist[i].vocolflg & VOCS_UNKNOWN) != 0)
                        ++unknown_count;

                    /* consume the element */
                    ++i;
                }
                else
                {
                    /* skip this element */
                    lstadv(&subp, &subsiz);
                }
            }
        }
    }

    /* terminate the list */
    inlist[i].vocolobj = MCMONINV;
    inlist[i].vocolflg = 0;

    /* 
     *   make a copy of our context, so the disambiguation can't make any
     *   global changes 
     */
    memcpy(&ctx_copy, ctx, sizeof(ctx_copy));

    /*
     *   Count the unknown words and set the count in the context.  This
     *   will allow us to determine after we call the resolver whether the
     *   resolution process cleared up the unknown words (via
     *   parseUnknownDobj/Iobj). 
     */
    ctx_copy.voccxunknown = ctx_copy.voccxlastunk = unknown_count;

    /* disambiguate the noun list */
    err = vocdisambig(&ctx_copy, outlist, inlist,
                      defprop, accprop, verprop, cmd,
                      otherobj, actor, verb, prep, cmdbuf, silent);

    /*
     *   If the error was VOCERR(2) - unknown word - check the input list
     *   to see if it contained any unknown words.  If it does, and we're
     *   not in "silent" mode, flag the error and then give the user a
     *   chance to use "oops" to correct the problem.  If we're in silent
     *   mode, don't display an error and don't allow interactive
     *   correction via "oops."
     *   
     *   It is possible that the unknown word is not in the input list,
     *   but in the user's response to an interactive disambiguation
     *   query.  This is why we must check to see if the unknown word is
     *   in the original input list or not.
     */
    if (err == VOCERR(2) && ctx_copy.voccxunknown != 0 && !silent)
    {
        char *unk;
        int unk_idx;
        char *rpl_text;

        /* 
         *   forget we have unknown words, since we're going to handle
         *   them now
         */
        ctx_copy.voccxunknown = 0;

        /* 
         *   find the unknown word - look up each word until we find one
         *   that's not in the dictionary 
         */
        for (i = 0, unk = 0 ; cmd[i] != 0 ; ++i)
        {
            int t;
            
            /* 
             *   get this word's type - if the word has no type, it's an
             *   unknown word 
             */
            t = voc_lookup_type(ctx, cmd[i], strlen(cmd[i]), TRUE);
            if (t == 0)
            {
                /* this is it - note it and stop searching */
                unk_idx = i;
                unk = cmd[i];
                break;
            }
        }

        /* 
         *   if we didn't find any unknown words, assume the first word
         *   was unknown 
         */
        if (unk == 0)
        {
            unk_idx = 0;
            unk = cmd[0];
        }

        /* display an error, and read a new command */
        rpl_text = voc_read_oops(&ctx_copy, oopsbuf, VOCBUFSIZ, unk);

        /* 
         *   if they didn't respond with "oops," treat the response as a
         *   brand new command to replace the current command 
         */
        if (rpl_text == 0)
        {
            /* 
             *   it's a replacement command - set the redo flag to
             *   indicate that we should process the replacement command 
             */
            ctx_copy.voccxredo = TRUE;

            /* copy the response into the command buffer */
            strcpy(cmdbuf, oopsbuf);
        }
        else
        {
            /* indicate the correction via the result code */
            err = VOCERR(45);

            /* 
             *   Build the new command string.  The new command string
             *   consists of all of the tokens up to the unknown token,
             *   then the replacement text, then all of the remaining
             *   tokens. 
             */
            for (p = cmdbuf, i = 0 ; cmd[i] != 0 ; ++i)
            {
                size_t needed;
                
                /* figure the size needs for this token */
                if (i == unk_idx)
                {
                    /* we need to insert the replacement text */
                    needed = strlen(rpl_text);
                }
                else
                {
                    /* we need to insert this token string */
                    needed = strlen(cmd[i]);
                }
                
                /* 
                 *   if more tokens follow, we need a space after the
                 *   replacement text to separate it from what follows 
                 */
                if (cmd[i+1] != 0 && needed != 0)
                    needed += 1;

                /* leave room for null termination */
                needed += 1;

                /* if we don't have room for this token, stop now */
                if (needed > (size_t)(VOCBUFSIZ - (p - cmdbuf)))
                    break;

                /* 
                 *   if we've reached the unknown token, insert the
                 *   replacement text; otherwise, insert this token
                 */
                if (i == unk_idx)
                {
                    /* insert the replacement text */
                    strcpy(p, rpl_text);
                }
                else if (*cmd[i] == '"')
                {
                    char *p1;
                    char qu;
                    
                    /* 
                     *   Scan the quoted string for embedded double quotes
                     *   - if it has any, use single quotes as the
                     *   delimiter; otherwise, use double quotes as the
                     *   delimiter.  Note that we ignore the first and
                     *   last characters in the string, since these are
                     *   always the delimiting double quotes in the
                     *   original token text.  
                     */
                    for (qu = '"', p1 = cmd[i] + 1 ;
                         *p1 != '\0' && *(p1 + 1) != '\0' ; ++p1)
                    {
                        /* check for an embedded double quote */
                        if (*p1 == '"')
                        {
                            /* switch to single quotes as delimiters */
                            qu = '\'';

                            /* no need to look any further */
                            break;
                        }
                    }

                    /* add the open quote */
                    *p++ = qu;

                    /* 
                     *   add the text, leaving out the first and last
                     *   characters (which are the original quotes) 
                     */
                    if (strlen(cmd[i]) > 2)
                    {
                        memcpy(p, cmd[i] + 1, strlen(cmd[i]) - 2);
                        p += strlen(cmd[i]) - 2;
                    }

                    /* add the closing quote */
                    *p++ = qu;

                    /* null-terminate here so we don't skip any further */
                    *p = '\0';
                }
                else
                {
                    /* copy this word */
                    strcpy(p, cmd[i]);
                }

                /* move past this token */
                p += strlen(p);

                /* add a space if another token follows */
                if (cmd[i+1] != 0)
                    *p++ = ' ';
            }

            /* null-terminate the replacement text */
            *p = '\0';
        }
    }

    /* 
     *   Count the objects.  An object list is returned only on success or
     *   VOCERR(44), which indicates that the list is still ambiguous. 
     */
    if (err == 0 || err == VOCERR(44))
    {
        /* count the objects in the list */
        for (i = 0 ; outlist[i].vocolobj != MCMONINV ; ++i) ;
        objcnt = i;
    }
    else
    {
        /* there's nothing in the list */
        objcnt = 0;
    }

    /* figure out how much space we need for the objects */
    lstsiz = (1+2) * objcnt;
        
    /* add space for the first element, which contains the status code */
    lstsiz += (1 + 4);

    /* if there's a new command string, we'll store it, so make room */
    if (ctx_copy.voccxredo || err == VOCERR(45))
    {
        /* 
         *   add space for the type prefix (1), length prefix (2), and the
         *   string bytes (with no null terminator, of course) 
         */
        lstsiz += (1 + 2 + strlen(cmdbuf));

        /* 
         *   if we're retrying due to the redo flag, always return the
         *   RETRY error code, regardless of what caused us to retry the
         *   command 
         */
        if (ctx_copy.voccxredo)
            err = VOCERR(43);
    }

    /* push a list with space for the objects */
    lstp = voc_push_list_siz(ctx, lstsiz);

    /* store the status code in the first element */
    *lstp++ = DAT_NUMBER;
    oswp4s(lstp, err);
    lstp += 4;

    /* store the remainder of the list */
    if (err == 0 || err == VOCERR(44))
    {
        /* fill in the list with the objects */
        for (i = 0 ; i < objcnt ; ++i)
        {
            /* set this element */
            *lstp++ = DAT_OBJECT;
            oswp2(lstp, outlist[i].vocolobj);
            lstp += 2;
        }
    }
    else if (ctx_copy.voccxredo || err == VOCERR(45))
    {
        uint len;
        
        /* there's a new command - return it as the second element */
        *lstp++ = DAT_SSTRING;

        /* store the length */
        len = strlen(cmdbuf);
        oswp2(lstp, len + 2);
        lstp += 2;

        /* store the string */
        memcpy(lstp, cmdbuf, len);
    }

    /* leave the stack frame */
    voc_leave(ctx, save_sp);
}